

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Message.cpp
# Opt level: O0

string * __thiscall
FIX::Message::toString
          (Message *this,string *str,int beginStringField,int bodyLengthField,int checkSumField)

{
  int iVar1;
  int data;
  FieldBase local_f0;
  FieldBase local_88;
  long local_30;
  size_t length;
  int local_20;
  int checkSumField_local;
  int bodyLengthField_local;
  int beginStringField_local;
  string *str_local;
  Message *this_local;
  
  length._4_4_ = checkSumField;
  local_20 = bodyLengthField;
  checkSumField_local = beginStringField;
  _bodyLengthField_local = str;
  str_local = (string *)this;
  iVar1 = bodyLength(this,beginStringField,bodyLengthField,checkSumField);
  local_30 = (long)iVar1;
  IntField::IntField((IntField *)&local_88,local_20,iVar1);
  FieldMap::setField(&(this->m_header).super_FieldMap,&local_88,true);
  IntField::~IntField((IntField *)&local_88);
  iVar1 = length._4_4_;
  data = checkSum(this,length._4_4_);
  CheckSumField::CheckSumField((CheckSumField *)&local_f0,iVar1,data);
  FieldMap::setField(&(this->m_trailer).super_FieldMap,&local_f0,true);
  CheckSumField::~CheckSumField((CheckSumField *)&local_f0);
  std::__cxx11::string::clear();
  std::__cxx11::string::reserve((ulong)_bodyLengthField_local);
  FieldMap::calculateString(&(this->m_header).super_FieldMap,_bodyLengthField_local);
  FieldMap::calculateString(&this->super_FieldMap,_bodyLengthField_local);
  FieldMap::calculateString(&(this->m_trailer).super_FieldMap,_bodyLengthField_local);
  return _bodyLengthField_local;
}

Assistant:

std::string &Message::toString(std::string &str, int beginStringField, int bodyLengthField, int checkSumField) const {
  size_t length = bodyLength(beginStringField, bodyLengthField, checkSumField);
  m_header.setField(IntField(bodyLengthField, static_cast<int>(length)));
  m_trailer.setField(CheckSumField(checkSumField, checkSum(checkSumField)));

#if defined(_MSC_VER) && _MSC_VER < 1300
  str = "";
#else
  str.clear();
#endif

  /*small speculation about the space needed for FIX string*/
  str.reserve(length + 64);

  m_header.calculateString(str);
  FieldMap::calculateString(str);
  m_trailer.calculateString(str);

  return str;
}